

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O1

char * leveldb::GetVarint64Ptr(char *p,char *limit,uint64_t *value)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  char *in_R9;
  long in_FS_OFFSET;
  bool bVar7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (p < limit) {
    uVar4 = 0;
    uVar6 = 0;
    pcVar5 = p + 1;
    do {
      bVar1 = pcVar5[-1];
      if ((char)bVar1 < '\0') {
        uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)uVar4 & 0x3f);
      }
      else {
        uVar6 = uVar6 | (ulong)bVar1 << ((byte)uVar4 & 0x3f);
        *value = uVar6;
        in_R9 = pcVar5;
      }
      pcVar3 = in_R9;
      if ((-1 < (char)bVar1) || (pcVar3 = (char *)0x0, 0x38 < uVar4)) break;
      uVar4 = uVar4 + 7;
      bVar7 = pcVar5 < limit;
      pcVar5 = pcVar5 + 1;
    } while (bVar7);
  }
  else {
    pcVar3 = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return pcVar3;
}

Assistant:

const char* GetVarint64Ptr(const char* p, const char* limit, uint64_t* value) {
  uint64_t result = 0;
  for (uint32_t shift = 0; shift <= 63 && p < limit; shift += 7) {
    uint64_t byte = *(reinterpret_cast<const uint8_t*>(p));
    p++;
    if (byte & 128) {
      // More bytes are present
      result |= ((byte & 127) << shift);
    } else {
      result |= (byte << shift);
      *value = result;
      return reinterpret_cast<const char*>(p);
    }
  }
  return nullptr;
}